

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void assert_run_work(uv_loop_t *loop)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_work_t work_req;
  undefined1 auStack_88 [128];
  
  if (work_cb_count == 0) {
    if (after_work_cb_count == 0) {
      uVar1 = getpid();
      printf("Queue in %d\n",(ulong)uVar1);
      iVar2 = uv_queue_work(loop,auStack_88,work_cb,after_work_cb);
      if (iVar2 == 0) {
        uVar1 = getpid();
        printf("Running in %d\n",(ulong)uVar1);
        uv_run(loop,0);
        if (work_cb_count == 1) {
          if (after_work_cb_count == 1) {
            work_cb_count = 0;
            after_work_cb_count = 0;
            return;
          }
          pcVar4 = "after_work_cb_count == 1";
          uVar3 = 0x27a;
        }
        else {
          pcVar4 = "work_cb_count == 1";
          uVar3 = 0x279;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x275;
      }
    }
    else {
      pcVar4 = "after_work_cb_count == 0";
      uVar3 = 0x272;
    }
  }
  else {
    pcVar4 = "work_cb_count == 0";
    uVar3 = 0x271;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void assert_run_work(uv_loop_t* const loop) {
  uv_work_t work_req;
  int r;

  ASSERT(work_cb_count == 0);
  ASSERT(after_work_cb_count == 0);
  printf("Queue in %d\n", getpid());
  r = uv_queue_work(loop, &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  printf("Running in %d\n", getpid());
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  /* cleanup  */
  work_cb_count = 0;
  after_work_cb_count = 0;
}